

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall
memory::
Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
::
Array<memory::Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>&,void>
          (Array<double,memory::HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>>
           *this,Array<double,_memory::HostCoordinator<double,_memory::Allocator<double,_memory::impl::AlignedPolicy<8UL>_>_>_>
                 *other)

{
  size_type sVar1;
  int iVar2;
  void *ptr;
  void *local_20;
  
  sVar1 = (other->super_ArrayView<double,_memory::HostCoordinator<double>_>).size_;
  if ((sVar1 == 0) || (iVar2 = posix_memalign(&local_20,8,sVar1 * 8), iVar2 != 0)) {
    local_20 = (void *)0x0;
  }
  *(void **)(this + 8) = local_20;
  *(size_type *)(this + 0x10) = sVar1;
  HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>::
  copy<memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>>
            ((HostCoordinator<double,memory::Allocator<double,memory::impl::AlignedPolicy<8ul>>> *)
             (this + 0x18),&other->super_ArrayView<double,_memory::HostCoordinator<double>_>,
             (ArrayView<value_type,_HostCoordinator<value_type,_Allocator<double,_AlignedPolicy<8UL>_>_>_>
              *)this);
  return;
}

Assistant:

Array(Other&& other)
        : base(coordinator_type().allocate(other.size()))
    {
        coordinator_.copy(other, *this);
    }